

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O3

int nn_xsurveyor_add(nn_sockbase *self,nn_pipe *pipe)

{
  undefined8 *data;
  int rcvprio;
  size_t sz;
  int local_24;
  size_t local_20;
  
  local_20 = 4;
  nn_pipe_getopt(pipe,0,9,&local_24,&local_20);
  if (local_20 == 4) {
    if (0xffffffef < local_24 - 0x11U) {
      data = (undefined8 *)nn_alloc_(0x40);
      if (data != (undefined8 *)0x0) {
        *data = pipe;
        nn_fq_add((nn_fq *)&self[2].sock,(nn_fq_data *)(data + 4),pipe,local_24);
        nn_dist_add((nn_dist *)(self + 1),(nn_dist_data *)(data + 1),pipe);
        nn_pipe_setdata(pipe,data);
        return 0;
      }
      goto LAB_0015369a;
    }
  }
  else {
    nn_xsurveyor_add_cold_1();
  }
  nn_xsurveyor_add_cold_3();
LAB_0015369a:
  nn_xsurveyor_add_cold_2();
}

Assistant:

int nn_xsurveyor_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsurveyor *xsurveyor;
    struct nn_xsurveyor_data *data;
    int rcvprio;
    size_t sz;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xsurveyor_data),
        "pipe data (xsurveyor)");
    alloc_assert (data);
    data->pipe = pipe;
    nn_fq_add (&xsurveyor->inpipes, &data->initem, pipe, rcvprio);
    nn_dist_add (&xsurveyor->outpipes, &data->outitem, pipe);
    nn_pipe_setdata (pipe, data);

    return 0;
}